

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderApiTests.cpp
# Opt level: O3

void deqp::gles31::Functional::NegativeTestShared::uniformuiv_invalid_program
               (NegativeTestContext *ctx)

{
  GLuint *value;
  value_type_conflict4 *__val;
  string local_38;
  
  value = (GLuint *)operator_new(0x10);
  value[0] = 0;
  value[1] = 0;
  value[2] = 0;
  value[3] = 0;
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_38,
             "GL_INVALID_OPERATION is generated if there is no current program object.","");
  NegativeTestContext::beginSection(ctx,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  glu::CallLogWrapper::glUseProgram(&ctx->super_CallLogWrapper,0);
  glu::CallLogWrapper::glUniform1uiv(&ctx->super_CallLogWrapper,-1,1,value);
  NegativeTestContext::expectError(ctx,0x502);
  glu::CallLogWrapper::glUniform2uiv(&ctx->super_CallLogWrapper,-1,1,value);
  NegativeTestContext::expectError(ctx,0x502);
  glu::CallLogWrapper::glUniform3uiv(&ctx->super_CallLogWrapper,-1,1,value);
  NegativeTestContext::expectError(ctx,0x502);
  glu::CallLogWrapper::glUniform4uiv(&ctx->super_CallLogWrapper,-1,1,value);
  NegativeTestContext::expectError(ctx,0x502);
  NegativeTestContext::endSection(ctx);
  operator_delete(value,0x10);
  return;
}

Assistant:

void uniformuiv_invalid_program (NegativeTestContext& ctx)
{
	std::vector<GLuint> data(4);

	ctx.beginSection("GL_INVALID_OPERATION is generated if there is no current program object.");
	ctx.glUseProgram(0);
	ctx.glUniform1uiv(-1, 1, &data[0]);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.glUniform2uiv(-1, 1, &data[0]);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.glUniform3uiv(-1, 1, &data[0]);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.glUniform4uiv(-1, 1, &data[0]);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.endSection();
}